

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::
parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&>
          (detail *this,basic_string_view<char> format_str,
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          *handler)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *end_00;
  char local_59;
  id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&,_char>
  iStack_48;
  char c;
  char *local_40;
  char *p;
  char *end;
  char *begin;
  writer write;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *handler_local;
  basic_string_view<char> format_str_local;
  
  begin = (char *)format_str.size_;
  format_str_local.data_ = format_str.data_;
  write.handler_ =
       (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
        *)begin;
  handler_local =
       (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
        *)this;
  pcVar2 = basic_string_view<char>::data((basic_string_view<char> *)&handler_local);
  end = pcVar2;
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&handler_local);
  p = pcVar2 + sVar3;
  do {
    if (end == p) {
      return;
    }
    local_40 = end;
    if ((*end != '{') && (bVar1 = find<false,char,char_const*>(end + 1,p,'{',&local_40), !bVar1)) {
      parse_format_string<false,_char,_fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&>
      ::writer::operator()((writer *)&begin,end,p);
      return;
    }
    parse_format_string<false,_char,_fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&>
    ::writer::operator()((writer *)&begin,end,local_40);
    pcVar2 = local_40 + 1;
    if (pcVar2 == p) {
      local_40 = pcVar2;
      error_handler::on_error((error_handler *)write.handler_,"invalid format string");
    }
    if (*pcVar2 == '}') {
      local_40 = pcVar2;
      format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
      ::on_arg_id(write.handler_);
      format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
      ::on_replacement_field(write.handler_,local_40);
    }
    else if (*pcVar2 == '{') {
      end_00 = local_40 + 2;
      local_40 = pcVar2;
      format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
      ::on_text(write.handler_,pcVar2,end_00);
    }
    else {
      iStack_48.handler = write.handler_;
      local_40 = pcVar2;
      local_40 = parse_arg_id<char,fmt::v6::detail::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&,char>>
                           (pcVar2,p,&stack0xffffffffffffffb8);
      if (local_40 == p) {
        local_59 = '\0';
      }
      else {
        local_59 = *local_40;
      }
      if (local_59 == '}') {
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
        ::on_replacement_field(write.handler_,local_40);
      }
      else {
        if (local_59 != ':') {
          error_handler::on_error((error_handler *)write.handler_,"missing \'}\' in format string");
        }
        local_40 = format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                   ::on_format_specs(write.handler_,local_40 + 1,p);
        if ((local_40 == p) || (*local_40 != '}')) {
          error_handler::on_error((error_handler *)write.handler_,"unknown format specifier");
        }
      }
    }
    end = local_40 + 1;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin + 1, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}